

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::AssemblyGrammar::lookupSpecConstantOpcode(AssemblyGrammar *this,char *name,Op *opcode)

{
  int iVar1;
  spv_result_t sVar2;
  ulong uVar3;
  spv_ext_inst_table_t *psVar4;
  
  uVar3 = 0x10;
  psVar4 = (spv_ext_inst_table_t *)&DAT_00952360;
  do {
    iVar1 = strcmp(name,(char *)psVar4[-2].groups);
    if (iVar1 == 0) {
      psVar4 = psVar4 + -2;
      goto LAB_00622cfd;
    }
    iVar1 = strcmp(name,(char *)psVar4[-1].groups);
    if (iVar1 == 0) {
      psVar4 = psVar4 + -1;
      goto LAB_00622cfd;
    }
    iVar1 = strcmp(name,(char *)psVar4->groups);
    if (iVar1 == 0) goto LAB_00622cfd;
    iVar1 = strcmp(name,(char *)psVar4[1].groups);
    if (iVar1 == 0) {
      psVar4 = psVar4 + 1;
      goto LAB_00622cfd;
    }
    uVar3 = uVar3 - 1;
    psVar4 = psVar4 + 4;
  } while (1 < uVar3);
  iVar1 = strcmp(name,"CooperativeMatrixLengthKHR");
  psVar4 = (spv_ext_inst_table_t *)(&DAT_00952700 + (ulong)(iVar1 != 0) * 0x10);
LAB_00622cfd:
  if (psVar4 == &kTable_1_0) {
    sVar2 = SPV_ERROR_INVALID_LOOKUP;
  }
  else {
    *opcode = psVar4->count;
    sVar2 = SPV_SUCCESS;
  }
  return sVar2;
}

Assistant:

spv_result_t AssemblyGrammar::lookupSpecConstantOpcode(const char* name,
                                                       spv::Op* opcode) const {
  const auto* last = kOpSpecConstantOpcodes + kNumOpSpecConstantOpcodes;
  const auto* found =
      std::find_if(kOpSpecConstantOpcodes, last,
                   [name](const SpecConstantOpcodeEntry& entry) {
                     return 0 == strcmp(name, entry.name);
                   });
  if (found == last) return SPV_ERROR_INVALID_LOOKUP;
  *opcode = found->opcode;
  return SPV_SUCCESS;
}